

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-face.c
# Opt level: O2

int ndn_unix_face_send(ndn_face_intf_t *self,uint8_t *packet,uint32_t size)

{
  ulong uVar1;
  
  uVar1 = send(*(int *)&self[4].up,packet,(ulong)size,0);
  return (uint)(uVar1 != size) * 2;
}

Assistant:

static int
ndn_unix_face_send(ndn_face_intf_t* self, const uint8_t* packet, uint32_t size){
  ndn_unix_face_t* ptr = container_of(self, ndn_unix_face_t, intf);
  ssize_t ret;
  ret = send(ptr->sock, packet, size, 0);
  if(ret != size){
    return NDN_UNIX_FACE_SOCKET_ERROR;
  }else{
    return NDN_SUCCESS;
  }
}